

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O0

int uudecode_filter_close(archive_read_filter *self)

{
  void *__ptr;
  long in_RDI;
  uudecode *uudecode;
  
  __ptr = *(void **)(in_RDI + 0x50);
  free(*(void **)((long)__ptr + 8));
  free(*(void **)((long)__ptr + 0x20));
  free(__ptr);
  return 0;
}

Assistant:

static int
uudecode_filter_close(struct archive_read_filter *self)
{
	struct uudecode *uudecode;

	uudecode = (struct uudecode *)self->data;
	free(uudecode->in_buff);
	free(uudecode->out_buff);
	free(uudecode);

	return (ARCHIVE_OK);
}